

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

int MuxImageParse(WebPChunk *chunk,int copy_data,WebPMuxImage *wpi)

{
  WebPMuxError WVar1;
  WebPChunkId WVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  size_t data_size;
  WebPChunk **unknown_chunk_list;
  WebPChunk subchunk;
  WebPData temp;
  WebPChunk **local_68;
  WebPChunk local_60;
  WebPData local_40;
  
  puVar8 = (chunk->data).bytes;
  uVar5 = (chunk->data).size;
  puVar7 = puVar8 + uVar5;
  if (puVar8 == (uint8_t *)0x0) {
    puVar7 = (uint8_t *)0x0;
  }
  local_68 = &wpi->unknown;
  ChunkInit(&local_60);
  local_40.size = 0x10;
  local_40.bytes = puVar8;
  if (((0xf < uVar5) &&
      (WVar1 = ChunkAssignData(&local_60,&local_40,copy_data,chunk->tag), WVar1 == WEBP_MUX_OK)) &&
     (WVar1 = ChunkSetHead(&local_60,&wpi->header), WVar1 == WEBP_MUX_OK)) {
    wpi->is_partial = 1;
    uVar4 = (ulong)((int)local_60.data.size + 1U & 0xfffffffe);
    puVar8 = puVar8 + uVar4;
    if (puVar8 != puVar7) {
      data_size = uVar5 - uVar4;
      do {
        ChunkInit(&local_60);
        WVar1 = ChunkVerifyAndAssign(&local_60,puVar8,data_size,data_size,copy_data);
        if (WVar1 != WEBP_MUX_OK) goto LAB_0014f989;
        WVar2 = ChunkGetIdFromTag(local_60.tag);
        if (WVar2 == WEBP_CHUNK_UNKNOWN) {
          if ((wpi->is_partial != 0) ||
             (WVar1 = ChunkAppend(&local_60,&local_68), WVar1 != WEBP_MUX_OK)) goto LAB_0014f989;
        }
        else {
          if (WVar2 == WEBP_CHUNK_IMAGE) {
            if ((wpi->img != (WebPChunk *)0x0) ||
               (WVar1 = ChunkSetHead(&local_60,&wpi->img), WVar1 != WEBP_MUX_OK)) goto LAB_0014f989;
            iVar3 = MuxImageFinalize(wpi);
            iVar6 = 0;
            if (iVar3 == 0) goto LAB_0014f989;
          }
          else {
            if ((WVar2 != WEBP_CHUNK_ALPHA) || (wpi->alpha != (WebPChunk *)0x0)) goto LAB_0014f989;
            WVar1 = ChunkSetHead(&local_60,&wpi->alpha);
            iVar6 = 1;
            if (WVar1 != WEBP_MUX_OK) goto LAB_0014f989;
          }
          wpi->is_partial = iVar6;
        }
        uVar5 = (ulong)((int)local_60.data.size + 1U & 0xfffffffe);
        puVar8 = puVar8 + uVar5 + 8;
        data_size = data_size - (uVar5 + 8);
      } while (puVar8 != puVar7);
    }
    if (wpi->is_partial == 0) {
      return 1;
    }
  }
LAB_0014f989:
  ChunkRelease(&local_60);
  return 0;
}

Assistant:

static int MuxImageParse(const WebPChunk* const chunk, int copy_data,
                         WebPMuxImage* const wpi) {
  const uint8_t* bytes = chunk->data.bytes;
  size_t size = chunk->data.size;
  const uint8_t* const last = (bytes == NULL) ? NULL : bytes + size;
  WebPChunk subchunk;
  size_t subchunk_size;
  WebPChunk** unknown_chunk_list = &wpi->unknown;
  ChunkInit(&subchunk);

  assert(chunk->tag == kChunks[IDX_ANMF].tag);
  assert(!wpi->is_partial);

  // ANMF.
  {
    const size_t hdr_size = ANMF_CHUNK_SIZE;
    const WebPData temp = { bytes, hdr_size };
    // Each of ANMF chunk contain a header at the beginning. So, its size should
    // be at least 'hdr_size'.
    if (size < hdr_size) goto Fail;
    if (ChunkAssignData(&subchunk, &temp, copy_data,
                        chunk->tag) != WEBP_MUX_OK) {
      goto Fail;
    }
  }
  if (ChunkSetHead(&subchunk, &wpi->header) != WEBP_MUX_OK) goto Fail;
  wpi->is_partial = 1;  // Waiting for ALPH and/or VP8/VP8L chunks.

  // Rest of the chunks.
  subchunk_size = ChunkDiskSize(&subchunk) - CHUNK_HEADER_SIZE;
  bytes += subchunk_size;
  size -= subchunk_size;

  while (bytes != last) {
    ChunkInit(&subchunk);
    if (ChunkVerifyAndAssign(&subchunk, bytes, size, size,
                             copy_data) != WEBP_MUX_OK) {
      goto Fail;
    }
    switch (ChunkGetIdFromTag(subchunk.tag)) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha != NULL) goto Fail;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&subchunk, &wpi->alpha) != WEBP_MUX_OK) goto Fail;
        wpi->is_partial = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (wpi->img != NULL) goto Fail;  // Only 1 image chunk allowed.
        if (ChunkSetHead(&subchunk, &wpi->img) != WEBP_MUX_OK) goto Fail;
        if (!MuxImageFinalize(wpi)) goto Fail;
        wpi->is_partial = 0;  // wpi is completely filled.
        break;
      case WEBP_CHUNK_UNKNOWN:
        if (wpi->is_partial) {
          goto Fail;  // Encountered an unknown chunk
                      // before some image chunks.
        }
        if (ChunkAppend(&subchunk, &unknown_chunk_list) != WEBP_MUX_OK) {
          goto Fail;
        }
        break;
      default:
        goto Fail;
    }
    subchunk_size = ChunkDiskSize(&subchunk);
    bytes += subchunk_size;
    size -= subchunk_size;
  }
  if (wpi->is_partial) goto Fail;
  return 1;

 Fail:
  ChunkRelease(&subchunk);
  return 0;
}